

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

QString * fmt::v5::format<FakeQt::QString,my_ns::my_string<wchar_t>>
                    (QString *format_str,my_string<wchar_t> *args)

{
  QString *in_RDI;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  in_stack_00000800;
  basic_string_view<wchar_t> in_stack_00000810;
  QString *this;
  
  this = in_RDI;
  FakeQt::to_string_view(in_RDI);
  internal::checked_args<FakeQt::QString,_my_ns::my_string<wchar_t>_>::checked_args
            ((checked_args<FakeQt::QString,_my_ns::my_string<wchar_t>_> *)this,in_RDI,
             (my_string<wchar_t> *)0x12bdd7);
  internal::checked_args<FakeQt::QString,_my_ns::my_string<wchar_t>_>::operator*
            ((checked_args<FakeQt::QString,_my_ns::my_string<wchar_t>_> *)0x12bde1);
  internal::vformat<wchar_t>(in_stack_00000810,in_stack_00000800);
  return this;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}